

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  tinfl_status tVar1;
  int iVar2;
  size_t sStack_2b58;
  tinfl_status status;
  size_t dst_buf_size;
  size_t in_buf_size;
  size_t dict_ofs;
  size_t in_buf_ofs;
  mz_uint8 *pDict;
  tinfl_decompressor decomp;
  int result;
  int flags_local;
  void *pPut_buf_user_local;
  tinfl_put_buf_func_ptr pPut_buf_func_local;
  size_t *pIn_buf_size_local;
  void *pIn_buf_local;
  
  decomp.m_len_codes[0x1c4] = '\0';
  decomp.m_len_codes[0x1c5] = '\0';
  decomp.m_len_codes[0x1c6] = '\0';
  decomp.m_len_codes[0x1c7] = '\0';
  decomp._10996_4_ = flags;
  in_buf_ofs = (size_t)malloc(0x8000);
  dict_ofs = 0;
  in_buf_size = 0;
  if ((void *)in_buf_ofs == (void *)0x0) {
    pIn_buf_local._4_4_ = -1;
  }
  else {
    pDict._0_4_ = 0;
    while( true ) {
      dst_buf_size = *pIn_buf_size - dict_ofs;
      sStack_2b58 = 0x8000 - in_buf_size;
      tVar1 = tinfl_decompress((tinfl_decompressor *)&pDict,(mz_uint8 *)((long)pIn_buf + dict_ofs),
                               &dst_buf_size,(mz_uint8 *)in_buf_ofs,
                               (mz_uint8 *)(in_buf_ofs + in_buf_size),&stack0xffffffffffffd4a8,
                               decomp._10996_4_ & 0xfffffff9);
      dict_ofs = dst_buf_size + dict_ofs;
      if ((sStack_2b58 != 0) &&
         (iVar2 = (*pPut_buf_func)((void *)(in_buf_ofs + in_buf_size),(int)sStack_2b58,pPut_buf_user
                                  ), iVar2 == 0)) goto LAB_0057a186;
      if (tVar1 != TINFL_STATUS_HAS_MORE_OUTPUT) break;
      in_buf_size = in_buf_size + sStack_2b58 & 0x7fff;
    }
    decomp.m_len_codes._452_4_ = ZEXT14(tVar1 == TINFL_STATUS_DONE);
LAB_0057a186:
    free((void *)in_buf_ofs);
    *pIn_buf_size = dict_ofs;
    pIn_buf_local._4_1_ = decomp.m_len_codes[0x1c4];
    pIn_buf_local._5_1_ = decomp.m_len_codes[0x1c5];
    pIn_buf_local._6_1_ = decomp.m_len_codes[0x1c6];
    pIn_buf_local._7_1_ = decomp.m_len_codes[0x1c7];
  }
  return pIn_buf_local._4_4_;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void *pIn_buf, size_t *pIn_buf_size,
                                     tinfl_put_buf_func_ptr pPut_buf_func,
                                     void *pPut_buf_user, int flags) {
  int result = 0;
  tinfl_decompressor decomp;
  mz_uint8 *pDict = (mz_uint8 *)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
  size_t in_buf_ofs = 0, dict_ofs = 0;
  if (!pDict)
    return TINFL_STATUS_FAILED;
  tinfl_init(&decomp);
  for (;;) {
    size_t in_buf_size = *pIn_buf_size - in_buf_ofs,
           dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
    tinfl_status status =
        tinfl_decompress(&decomp, (const mz_uint8 *)pIn_buf + in_buf_ofs,
                         &in_buf_size, pDict, pDict + dict_ofs, &dst_buf_size,
                         (flags & ~(TINFL_FLAG_HAS_MORE_INPUT |
                                    TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
    in_buf_ofs += in_buf_size;
    if ((dst_buf_size) &&
        (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
      break;
    if (status != TINFL_STATUS_HAS_MORE_OUTPUT) {
      result = (status == TINFL_STATUS_DONE);
      break;
    }
    dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
  }
  MZ_FREE(pDict);
  *pIn_buf_size = in_buf_ofs;
  return result;
}